

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O3

bool __thiscall
MeCab::anon_unknown_0::TaggerImpl::parseNBestInit(TaggerImpl *this,char *str,size_t len)

{
  Lattice *pLVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Lattice *pLVar5;
  
  pLVar5 = (this->lattice_).ptr_;
  if (pLVar5 == (Lattice *)0x0) {
    iVar3 = (*(this->current_model_->super_Model)._vptr_Model[4])();
    pLVar5 = (Lattice *)CONCAT44(extraout_var,iVar3);
    pLVar1 = (this->lattice_).ptr_;
    if (pLVar1 != (Lattice *)0x0) {
      (*pLVar1->_vptr_Lattice[0x27])();
    }
    (this->lattice_).ptr_ = pLVar5;
  }
  (*pLVar5->_vptr_Lattice[10])(pLVar5,str,len);
  initRequestType(this);
  (*pLVar5->_vptr_Lattice[0x14])(pLVar5,2);
  iVar3 = (**(this->super_Tagger)._vptr_Tagger)(this);
  if (SUB41(iVar3,0) == false) {
    iVar4 = (*pLVar5->_vptr_Lattice[0x24])(pLVar5);
    pcVar2 = (char *)(this->what_)._M_string_length;
    strlen((char *)CONCAT44(extraout_var_00,iVar4));
    std::__cxx11::string::_M_replace((ulong)&this->what_,0,pcVar2,CONCAT44(extraout_var_00,iVar4));
  }
  return SUB41(iVar3,0);
}

Assistant:

bool TaggerImpl::parseNBestInit(const char *str, size_t len) {
  Lattice *lattice = mutable_lattice();
  lattice->set_sentence(str, len);
  initRequestType();
  lattice->add_request_type(MECAB_NBEST);
  if (!parse(lattice)) {
    set_what(lattice->what());
    return false;
  }
  return true;
}